

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region_test.cc
# Opt level: O0

void __thiscall UnitTest_TestUseRegion_Test::TestBody(UnitTest_TestUseRegion_Test *this)

{
  bool bVar1;
  char **ppcVar2;
  char *pcVar3;
  AssertHelper local_518;
  Message local_510;
  int local_504;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_33;
  Message local_4e8;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_32;
  Message local_4c8;
  int local_4bc;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_31;
  Message local_4a0;
  int local_494;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_30;
  Message local_478;
  undefined1 local_470 [8];
  AssertionResult gtest_ar_29;
  Message local_458;
  int local_44c;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_28;
  Message local_430;
  int local_424;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_27;
  Message local_408;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_26;
  Message local_3e8;
  int local_3dc;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_25;
  Message local_3c0;
  int local_3b4;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_24;
  Message local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_23;
  Message local_378;
  int local_36c;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_22;
  Message local_350;
  int local_344;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_21;
  Message local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_20;
  Message local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_19;
  Message local_2e8;
  int local_2dc;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_18;
  Message local_2c0;
  int local_2b4;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_17;
  Message local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_16;
  Message local_278;
  int local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_15;
  Message local_250;
  int local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_14;
  Message local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_13;
  Message local_208;
  int local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_12;
  Message local_1e0;
  int local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_11;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_10;
  Message local_198;
  int local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_9;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_8;
  Message local_150;
  int local_144;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_7;
  Message local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_6;
  Message local_108;
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_5;
  Message local_e0;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_4;
  Message local_c0;
  int local_b4;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_3;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  Message local_58 [3];
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  Qiniu_Region *region;
  char **hosts;
  size_t count;
  UnitTest_TestUseRegion_Test *this_local;
  
  count = (size_t)this;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Qiniu_Use_Region("z0",1);
  ppcVar2 = Qiniu_Region_Get_Up_Preferred_Hosts
                      ((Qiniu_Region *)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,(size_t *)&hosts);
  local_3c = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_38,"count","2",(unsigned_long *)&hosts,&local_3c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x4f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_70,"hosts[0]","\"https://upload.qiniup.com\"",*ppcVar2,
             "https://upload.qiniup.com");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x50,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_90,"hosts[1]","\"https://up.qiniup.com\"",ppcVar2[1],
             "https://up.qiniup.com");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  ppcVar2 = Qiniu_Region_Get_Up_Alternative_Hosts
                      ((Qiniu_Region *)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,(size_t *)&hosts);
  local_b4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_b0,"count","1",(unsigned_long *)&hosts,&local_b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x54,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_d8,"hosts[0]","\"https://up.qbox.me\"",*ppcVar2,"https://up.qbox.me")
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x55,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  ppcVar2 = Qiniu_Region_Get_Io_Preferred_Hosts
                      ((Qiniu_Region *)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,(size_t *)&hosts);
  local_fc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_f8,"count","1",(unsigned_long *)&hosts,&local_fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x58,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_120,"hosts[0]","\"https://iovip.qiniuio.com\"",*ppcVar2,
             "https://iovip.qiniuio.com");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  ppcVar2 = Qiniu_Region_Get_Io_Alternative_Hosts
                      ((Qiniu_Region *)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,(size_t *)&hosts);
  local_144 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_140,"count","1",(unsigned_long *)&hosts,&local_144);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x5c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_168,"hosts[0]","\"https://iovip.qbox.me\"",*ppcVar2,
             "https://iovip.qbox.me");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x5d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  ppcVar2 = Qiniu_Region_Get_Rs_Preferred_Hosts
                      ((Qiniu_Region *)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,(size_t *)&hosts);
  local_18c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_188,"count","1",(unsigned_long *)&hosts,&local_18c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x60,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1b0,"hosts[0]","\"https://rs-z0.qiniuapi.com\"",*ppcVar2,
             "https://rs-z0.qiniuapi.com");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  Qiniu_Region_Get_Rs_Alternative_Hosts
            ((Qiniu_Region *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(size_t *)&hosts);
  local_1d4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1d0,"count","0",(unsigned_long *)&hosts,&local_1d4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,100,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  ppcVar2 = Qiniu_Region_Get_Rsf_Preferred_Hosts
                      ((Qiniu_Region *)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,(size_t *)&hosts);
  local_1fc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1f8,"count","1",(unsigned_long *)&hosts,&local_1fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x67,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_220,"hosts[0]","\"https://rsf-z0.qiniuapi.com\"",*ppcVar2,
             "https://rsf-z0.qiniuapi.com");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x68,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  Qiniu_Region_Get_Rsf_Alternative_Hosts
            ((Qiniu_Region *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(size_t *)&hosts);
  local_244 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_240,"count","0",(unsigned_long *)&hosts,&local_244);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x6b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  ppcVar2 = Qiniu_Region_Get_Api_Preferred_Hosts
                      ((Qiniu_Region *)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,(size_t *)&hosts);
  local_26c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_268,"count","1",(unsigned_long *)&hosts,&local_26c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x6e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_290,"hosts[0]","\"https://api-z0.qiniuapi.com\"",*ppcVar2,
             "https://api-z0.qiniuapi.com");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_298);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x6f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  Qiniu_Region_Get_Api_Alternative_Hosts
            ((Qiniu_Region *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(size_t *)&hosts);
  local_2b4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2b0,"count","0",(unsigned_long *)&hosts,&local_2b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x72,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  Qiniu_Region_Free((Qiniu_Region *)
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Qiniu_Use_Region("z1",0);
  ppcVar2 = Qiniu_Region_Get_Up_Preferred_Hosts
                      ((Qiniu_Region *)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,(size_t *)&hosts);
  local_2dc = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2d8,"count","2",(unsigned_long *)&hosts,&local_2dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x79,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_300,"hosts[0]","\"http://upload-z1.qiniup.com\"",*ppcVar2,
             "http://upload-z1.qiniup.com");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x7a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_308);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_320,"hosts[1]","\"http://up-z1.qiniup.com\"",ppcVar2[1],
             "http://up-z1.qiniup.com");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
  if (!bVar1) {
    testing::Message::Message(&local_328);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x7b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
  Qiniu_Region_Get_Up_Alternative_Hosts
            ((Qiniu_Region *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(size_t *)&hosts);
  local_344 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_340,"count","0",(unsigned_long *)&hosts,&local_344);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x7e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
  ppcVar2 = Qiniu_Region_Get_Io_Preferred_Hosts
                      ((Qiniu_Region *)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,(size_t *)&hosts);
  local_36c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_368,"count","1",(unsigned_long *)&hosts,&local_36c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(&local_378);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x81,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_390,"hosts[0]","\"http://iovip-z1.qiniuio.com\"",*ppcVar2,
             "http://iovip-z1.qiniuio.com");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x82,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  Qiniu_Region_Get_Io_Alternative_Hosts
            ((Qiniu_Region *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(size_t *)&hosts);
  local_3b4 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3b0,"count","0",(unsigned_long *)&hosts,&local_3b4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x85,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  ppcVar2 = Qiniu_Region_Get_Rs_Preferred_Hosts
                      ((Qiniu_Region *)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,(size_t *)&hosts);
  local_3dc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_3d8,"count","1",(unsigned_long *)&hosts,&local_3dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_3e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x88,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_400,"hosts[0]","\"http://rs-z1.qiniuapi.com\"",*ppcVar2,
             "http://rs-z1.qiniuapi.com");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x89,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_408);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  Qiniu_Region_Get_Rs_Alternative_Hosts
            ((Qiniu_Region *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(size_t *)&hosts);
  local_424 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_420,"count","0",(unsigned_long *)&hosts,&local_424);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_420);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x8c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  ppcVar2 = Qiniu_Region_Get_Rsf_Preferred_Hosts
                      ((Qiniu_Region *)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,(size_t *)&hosts);
  local_44c = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_448,"count","1",(unsigned_long *)&hosts,&local_44c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x8f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_458);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_470,"hosts[0]","\"http://rsf-z1.qiniuapi.com\"",*ppcVar2,
             "http://rsf-z1.qiniuapi.com");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(&local_478);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x90,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  Qiniu_Region_Get_Rsf_Alternative_Hosts
            ((Qiniu_Region *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(size_t *)&hosts);
  local_494 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_490,"count","0",(unsigned_long *)&hosts,&local_494);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(&local_4a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x93,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  ppcVar2 = Qiniu_Region_Get_Api_Preferred_Hosts
                      ((Qiniu_Region *)
                       gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,(size_t *)&hosts);
  local_4bc = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_4b8,"count","1",(unsigned_long *)&hosts,&local_4bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_32.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x96,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_32.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_32.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_4e0,"hosts[0]","\"http://api-z1.qiniuapi.com\"",*ppcVar2,
             "http://api-z1.qiniuapi.com");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_4e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_33.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_33.message_,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_33.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  Qiniu_Region_Get_Api_Alternative_Hosts
            ((Qiniu_Region *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,(size_t *)&hosts);
  local_504 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_500,"count","0",(unsigned_long *)&hosts,&local_504);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
  if (!bVar1) {
    testing::Message::Message(&local_510);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/region_test.cc"
               ,0x9a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_518,&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
  Qiniu_Region_Free((Qiniu_Region *)
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl);
  return;
}

Assistant:

TEST(UnitTest, TestUseRegion)
{
    size_t count;
    const char *const *hosts;

    Qiniu_Region *region = Qiniu_Use_Region("z0", Qiniu_True);

    hosts = Qiniu_Region_Get_Up_Preferred_Hosts(region, &count);
    EXPECT_EQ(count, 2);
    EXPECT_STREQ(hosts[0], "https://upload.qiniup.com");
    EXPECT_STREQ(hosts[1], "https://up.qiniup.com");

    hosts = Qiniu_Region_Get_Up_Alternative_Hosts(region, &count);
    EXPECT_EQ(count, 1);
    EXPECT_STREQ(hosts[0], "https://up.qbox.me");

    hosts = Qiniu_Region_Get_Io_Preferred_Hosts(region, &count);
    EXPECT_EQ(count, 1);
    EXPECT_STREQ(hosts[0], "https://iovip.qiniuio.com");

    hosts = Qiniu_Region_Get_Io_Alternative_Hosts(region, &count);
    EXPECT_EQ(count, 1);
    EXPECT_STREQ(hosts[0], "https://iovip.qbox.me");

    hosts = Qiniu_Region_Get_Rs_Preferred_Hosts(region, &count);
    EXPECT_EQ(count, 1);
    EXPECT_STREQ(hosts[0], "https://rs-z0.qiniuapi.com");

    hosts = Qiniu_Region_Get_Rs_Alternative_Hosts(region, &count);
    EXPECT_EQ(count, 0);

    hosts = Qiniu_Region_Get_Rsf_Preferred_Hosts(region, &count);
    EXPECT_EQ(count, 1);
    EXPECT_STREQ(hosts[0], "https://rsf-z0.qiniuapi.com");

    hosts = Qiniu_Region_Get_Rsf_Alternative_Hosts(region, &count);
    EXPECT_EQ(count, 0);

    hosts = Qiniu_Region_Get_Api_Preferred_Hosts(region, &count);
    EXPECT_EQ(count, 1);
    EXPECT_STREQ(hosts[0], "https://api-z0.qiniuapi.com");

    hosts = Qiniu_Region_Get_Api_Alternative_Hosts(region, &count);
    EXPECT_EQ(count, 0);

    Qiniu_Region_Free(region);

    region = Qiniu_Use_Region("z1", Qiniu_False);

    hosts = Qiniu_Region_Get_Up_Preferred_Hosts(region, &count);
    EXPECT_EQ(count, 2);
    EXPECT_STREQ(hosts[0], "http://upload-z1.qiniup.com");
    EXPECT_STREQ(hosts[1], "http://up-z1.qiniup.com");

    hosts = Qiniu_Region_Get_Up_Alternative_Hosts(region, &count);
    EXPECT_EQ(count, 0);

    hosts = Qiniu_Region_Get_Io_Preferred_Hosts(region, &count);
    EXPECT_EQ(count, 1);
    EXPECT_STREQ(hosts[0], "http://iovip-z1.qiniuio.com");

    hosts = Qiniu_Region_Get_Io_Alternative_Hosts(region, &count);
    EXPECT_EQ(count, 0);

    hosts = Qiniu_Region_Get_Rs_Preferred_Hosts(region, &count);
    EXPECT_EQ(count, 1);
    EXPECT_STREQ(hosts[0], "http://rs-z1.qiniuapi.com");

    hosts = Qiniu_Region_Get_Rs_Alternative_Hosts(region, &count);
    EXPECT_EQ(count, 0);

    hosts = Qiniu_Region_Get_Rsf_Preferred_Hosts(region, &count);
    EXPECT_EQ(count, 1);
    EXPECT_STREQ(hosts[0], "http://rsf-z1.qiniuapi.com");

    hosts = Qiniu_Region_Get_Rsf_Alternative_Hosts(region, &count);
    EXPECT_EQ(count, 0);

    hosts = Qiniu_Region_Get_Api_Preferred_Hosts(region, &count);
    EXPECT_EQ(count, 1);
    EXPECT_STREQ(hosts[0], "http://api-z1.qiniuapi.com");

    hosts = Qiniu_Region_Get_Api_Alternative_Hosts(region, &count);
    EXPECT_EQ(count, 0);

    Qiniu_Region_Free(region);
}